

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

int resolveLocal(Compiler *compiler,Token *name)

{
  Token *pTVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  Token *b;
  
  uVar4 = (ulong)(uint)compiler->localCount;
  pTVar1 = &compiler->locals[uVar4 - 1].name;
  do {
    b = pTVar1;
    if ((int)uVar4 < 1) {
      return -1;
    }
    _Var2 = identifiersEqual(name,b);
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    pTVar1 = (Token *)&b[-2].length;
  } while (!_Var2);
  if (b[1].type == ~TOKEN_LEFT_PAREN) {
    error("Cannot read local variable in its own initializer.");
  }
  return uVar3;
}

Assistant:

static int resolveLocal(Compiler *compiler, Token *name) {
    for (int i = compiler->localCount - 1; i >= 0; i--) {
        Local *local = &compiler->locals[i];
        if (identifiersEqual(name, &local->name)) {
            if (local->depth == -1) {
                error("Cannot read local variable in its own initializer.");
            }
            return i;
        }
    }

    return -1;
}